

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_object.cpp
# Opt level: O0

string __thiscall
mjs::anon_unknown_35::do_replace
          (anon_unknown_35 *this,string *str,value *match_val,value *replace_value)

{
  uint32_t *this_00;
  value_type vVar1;
  object_ptr *p;
  object *poVar2;
  string *psVar3;
  size_type sVar4;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar5;
  double dVar6;
  wstring_view wVar7;
  string sVar8;
  wstring_view local_1a8;
  wstring local_198 [32];
  string local_178;
  wstring_view local_168;
  wstring local_158 [32];
  wstring local_138 [8];
  wstring res;
  gc_heap *h;
  wchar_t *local_108;
  undefined4 local_100;
  undefined4 local_fc;
  uint32_t match_length;
  uint32_t match_index;
  value local_e8;
  undefined1 local_c0 [8];
  string match_str;
  undefined1 local_a0 [8];
  value match_index_val;
  wstring_view local_68;
  wstring local_58 [8];
  wstring s;
  object_ptr match;
  value *replace_value_local;
  value *match_val_local;
  string *str_local;
  
  vVar1 = value::type(match_val);
  if (vVar1 == null) {
    string::string((string *)this,str);
    uVar5 = extraout_RDX;
  }
  else {
    vVar1 = value::type(match_val);
    if (vVar1 != object) {
      __assert_fail("match_val.type() == value_type::object",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/regexp_object.cpp"
                    ,0x163,
                    "string mjs::(anonymous namespace)::do_replace(const string &, const value &, const value &)"
                   );
    }
    p = value::object_value(match_val);
    gc_heap_ptr<mjs::object>::gc_heap_ptr((gc_heap_ptr<mjs::object> *)((long)&s.field_2 + 8),p);
    local_68 = string::view(str);
    std::allocator<wchar_t>::allocator();
    std::__cxx11::wstring::wstring<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>,void>
              (local_58,&local_68,
               (allocator<wchar_t> *)
               ((long)&match_index_val.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                       super_gc_heap_ptr_untyped.pos_ + 3));
    std::allocator<wchar_t>::~allocator
              ((allocator<wchar_t> *)
               ((long)&match_index_val.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                       super_gc_heap_ptr_untyped.pos_ + 3));
    poVar2 = gc_heap_ptr<mjs::object>::operator->
                       ((gc_heap_ptr<mjs::object> *)((long)&s.field_2 + 8));
    this_00 = &match_str.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_;
    std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
              ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)this_00,L"index");
    (**poVar2->_vptr_object)(local_a0,poVar2,this_00);
    poVar2 = gc_heap_ptr<mjs::object>::operator->
                       ((gc_heap_ptr<mjs::object> *)((long)&s.field_2 + 8));
    std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
              ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&match_length,L"0");
    (**poVar2->_vptr_object)
              (&local_e8,poVar2,
               (basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&match_length);
    psVar3 = value::string_value(&local_e8);
    string::string((string *)local_c0,psVar3);
    value::~value(&local_e8);
    dVar6 = value::number_value((value *)local_a0);
    local_fc = (undefined4)(long)dVar6;
    wVar7 = string::view((string *)local_c0);
    local_108 = wVar7._M_str;
    h = (gc_heap *)wVar7._M_len;
    sVar4 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::length
                      ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&h);
    local_100 = (undefined4)sVar4;
    res.field_2._8_8_ = gc_heap_ptr_untyped::heap((gc_heap_ptr_untyped *)((long)&s.field_2 + 8));
    std::__cxx11::wstring::wstring(local_138);
    std::__cxx11::wstring::substr((ulong)local_158,(ulong)local_58);
    std::__cxx11::wstring::operator=(local_138,local_158);
    std::__cxx11::wstring::~wstring(local_158);
    do_get_replacement_string
              ((anon_unknown_35 *)&local_178,str,(object_ptr *)((long)&s.field_2 + 8),replace_value)
    ;
    local_168 = string::view(&local_178);
    std::__cxx11::wstring::operator+=(local_138,&local_168);
    string::~string(&local_178);
    std::__cxx11::wstring::substr((ulong)local_198,(ulong)local_58);
    std::__cxx11::wstring::operator+=(local_138,local_198);
    std::__cxx11::wstring::~wstring(local_198);
    uVar5 = res.field_2._8_8_;
    local_1a8 = (wstring_view)std::__cxx11::wstring::operator_cast_to_basic_string_view(local_138);
    string::string((string *)this,(gc_heap *)uVar5,&local_1a8);
    std::__cxx11::wstring::~wstring(local_138);
    string::~string((string *)local_c0);
    value::~value((value *)local_a0);
    std::__cxx11::wstring::~wstring(local_58);
    gc_heap_ptr<mjs::object>::~gc_heap_ptr((gc_heap_ptr<mjs::object> *)((long)&s.field_2 + 8));
    uVar5 = extraout_RDX_00;
  }
  sVar8.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped._8_8_ = uVar5;
  sVar8.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)this;
  return (string)sVar8.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped;
}

Assistant:

string do_replace(const string& str, const value& match_val, const value& replace_value) {
    if (match_val.type() == value_type::null) {
        return str;
    }
    assert(match_val.type() == value_type::object);
    const auto match           = match_val.object_value();
    const auto s               = std::wstring{str.view()};
    const auto match_index_val = match->get(L"index");
    const auto match_str       = match->get(L"0").string_value();
    const auto match_index     = static_cast<uint32_t>(match_index_val.number_value());
    const auto match_length    = static_cast<uint32_t>(match_str.view().length());

    auto& h = match.heap();

    std::wstring res;
    res = s.substr(0, match_index);
    res += do_get_replacement_string(str, match, replace_value).view();
    res += s.substr(match_index + match_length);
    return string{h, res};
}